

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O3

int Aig_ManCountXors(Aig_Man_t *p)

{
  Aig_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  pVVar2 = p->vObjs;
  if (pVVar2->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      pNode = (Aig_Obj_t *)pVVar2->pArray[lVar4];
      if (((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) &&
         (iVar1 = Aig_ObjIsMuxType(pNode), iVar1 != 0)) {
        iVar1 = Aig_ObjRecognizeExor(pNode,&local_38,&local_40);
        iVar3 = (iVar3 + 1) - (uint)(iVar1 == 0);
      }
      lVar4 = lVar4 + 1;
      pVVar2 = p->vObjs;
    } while (lVar4 < pVVar2->nSize);
  }
  return iVar3;
}

Assistant:

int Aig_ManCountXors( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFan0, * pFan1;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) && Aig_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            Counter++;
    return Counter;

}